

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsappcurses.cc
# Opt level: O0

void __thiscall
FrobTadsApplicationCurses::FrobTadsApplicationCurses
          (FrobTadsApplicationCurses *this,FrobOptions *opts)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  byte *in_RSI;
  undefined8 *in_RDI;
  uint bogusY;
  uint bogusX;
  FrobOptions *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  
  FrobTadsApplication::FrobTadsApplication
            ((FrobTadsApplication *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffeb8);
  *in_RDI = &PTR_init_0042a218;
  std::unique_ptr<FrobTadsWindow,std::default_delete<FrobTadsWindow>>::
  unique_ptr<std::default_delete<FrobTadsWindow>,void>
            ((unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  std::unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>>::
  unique_ptr<std::default_delete<unsigned_int[]>,void>
            ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  bVar1 = getTermSize((uint *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                      (uint *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  if (bVar1) {
    putenv(FrobTadsApplicationCurses::lines);
    putenv(FrobTadsApplicationCurses::columns);
  }
  initscr();
  cbreak();
  noecho();
  curs_set(0);
  nonl();
  if ((((*in_RSI & 1) != 0) && (bVar2 = has_colors(), (bVar2 & 1) != 0)) || ((in_RSI[1] & 1) != 0))
  {
    *(undefined1 *)((long)in_RDI + 0xa4) = 1;
    start_color();
    if ((in_RSI[2] & 1) != 0) {
      use_default_colors();
    }
    iVar3 = makeColorPair(0,0);
    init_pair((int)(short)iVar3);
    iVar3 = makeColorPair(1,0);
    init_pair((int)(short)iVar3,1,0);
    iVar3 = makeColorPair(2,0);
    init_pair((int)(short)iVar3,2,0);
    iVar3 = makeColorPair(3,0);
    init_pair((int)(short)iVar3,3,0);
    iVar3 = makeColorPair(4,0);
    init_pair((int)(short)iVar3,4,0);
    iVar3 = makeColorPair(5,0);
    init_pair((int)(short)iVar3,5,0);
    iVar3 = makeColorPair(6,0);
    init_pair((int)(short)iVar3,6,0);
    iVar3 = makeColorPair(0,1);
    init_pair((int)(short)iVar3,0,1);
    iVar3 = makeColorPair(1,1);
    init_pair((int)(short)iVar3,1);
    iVar3 = makeColorPair(2,1);
    init_pair((int)(short)iVar3,2,1);
    iVar3 = makeColorPair(3,1);
    init_pair((int)(short)iVar3,3,1);
    iVar3 = makeColorPair(4,1);
    init_pair((int)(short)iVar3,4,1);
    iVar3 = makeColorPair(5,1);
    init_pair((int)(short)iVar3,5,1);
    iVar3 = makeColorPair(6,1);
    init_pair((int)(short)iVar3,6,1);
    iVar3 = makeColorPair(7,1);
    init_pair((int)(short)iVar3,7,1);
    iVar3 = makeColorPair(0,2);
    init_pair((int)(short)iVar3,0,2);
    iVar3 = makeColorPair(1,2);
    init_pair((int)(short)iVar3,1,2);
    iVar3 = makeColorPair(2,2);
    init_pair((int)(short)iVar3,2);
    iVar3 = makeColorPair(3,2);
    init_pair((int)(short)iVar3,3,2);
    iVar3 = makeColorPair(4,2);
    init_pair((int)(short)iVar3,4,2);
    iVar3 = makeColorPair(5,2);
    init_pair((int)(short)iVar3,5,2);
    iVar3 = makeColorPair(6,2);
    init_pair((int)(short)iVar3,6,2);
    iVar3 = makeColorPair(7,2);
    init_pair((int)(short)iVar3,7,2);
    iVar3 = makeColorPair(0,3);
    init_pair((int)(short)iVar3,0,3);
    iVar3 = makeColorPair(1,3);
    init_pair((int)(short)iVar3,1,3);
    iVar3 = makeColorPair(2,3);
    init_pair((int)(short)iVar3,2,3);
    iVar3 = makeColorPair(3,3);
    init_pair((int)(short)iVar3,3);
    iVar3 = makeColorPair(4,3);
    init_pair((int)(short)iVar3,4,3);
    iVar3 = makeColorPair(5,3);
    init_pair((int)(short)iVar3,5,3);
    iVar3 = makeColorPair(6,3);
    init_pair((int)(short)iVar3,6,3);
    iVar3 = makeColorPair(7,3);
    init_pair((int)(short)iVar3,7,3);
    iVar3 = makeColorPair(0,4);
    init_pair((int)(short)iVar3,0,4);
    iVar3 = makeColorPair(1,4);
    init_pair((int)(short)iVar3,1,4);
    iVar3 = makeColorPair(2,4);
    init_pair((int)(short)iVar3,2,4);
    iVar3 = makeColorPair(3,4);
    init_pair((int)(short)iVar3,3,4);
    iVar3 = makeColorPair(4,4);
    init_pair((int)(short)iVar3,4);
    iVar3 = makeColorPair(5,4);
    init_pair((int)(short)iVar3,5,4);
    iVar3 = makeColorPair(6,4);
    init_pair((int)(short)iVar3,6,4);
    iVar3 = makeColorPair(7,4);
    init_pair((int)(short)iVar3,7,4);
    iVar3 = makeColorPair(0,5);
    init_pair((int)(short)iVar3,0,5);
    iVar3 = makeColorPair(1,5);
    init_pair((int)(short)iVar3,1,5);
    iVar3 = makeColorPair(2,5);
    init_pair((int)(short)iVar3,2,5);
    iVar3 = makeColorPair(3,5);
    init_pair((int)(short)iVar3,3,5);
    iVar3 = makeColorPair(4,5);
    init_pair((int)(short)iVar3,4,5);
    iVar3 = makeColorPair(5,5);
    init_pair((int)(short)iVar3,5);
    iVar3 = makeColorPair(6,5);
    init_pair((int)(short)iVar3,6,5);
    iVar3 = makeColorPair(7,5);
    init_pair((int)(short)iVar3,7,5);
    iVar3 = makeColorPair(0,6);
    init_pair((int)(short)iVar3,0,6);
    iVar3 = makeColorPair(1,6);
    init_pair((int)(short)iVar3,1,6);
    iVar3 = makeColorPair(2,6);
    init_pair((int)(short)iVar3,2,6);
    iVar3 = makeColorPair(3,6);
    init_pair((int)(short)iVar3,3,6);
    iVar3 = makeColorPair(4,6);
    init_pair((int)(short)iVar3,4,6);
    iVar3 = makeColorPair(5,6);
    init_pair((int)(short)iVar3,5,6);
    iVar3 = makeColorPair(6,6);
    init_pair((int)(short)iVar3,6);
    iVar3 = makeColorPair(7,6);
    init_pair((int)(short)iVar3,7,6);
    iVar3 = makeColorPair(0,7);
    init_pair((int)(short)iVar3,0,7);
    iVar3 = makeColorPair(1,7);
    init_pair((int)(short)iVar3,1,7);
    iVar3 = makeColorPair(2,7);
    init_pair((int)(short)iVar3,2,7);
    iVar3 = makeColorPair(3,7);
    init_pair((int)(short)iVar3,3,7);
    iVar3 = makeColorPair(4,7);
    init_pair((int)(short)iVar3,4,7);
    iVar3 = makeColorPair(5,7);
    init_pair((int)(short)iVar3,5,7);
    iVar3 = makeColorPair(6,7);
    init_pair((int)(short)iVar3,6,7);
    iVar3 = makeColorPair(7,7);
    init_pair((int)(short)iVar3,7);
  }
  return;
}

Assistant:

FrobTadsApplicationCurses::FrobTadsApplicationCurses( const FrobOptions& opts )
    : FrobTadsApplication(opts)
{
    // Before starting curses, we set the LINES and COLUMNS env.
    // variables to a "maximum" value.  This is needed in case we're
    // running on a system with an old/broken curses implementation
    // (Solaris curses, for example).  This forces curses to
    // allocate enough internal memory for the windows in case the
    // terminal gets resized.  Note that we only do this if
    // detection of the terminal size is possible at all.
#if HAVE_PUTENV
    unsigned bogusX, bogusY; // Dummies.
    if (getTermSize(bogusX, bogusY)) {
        // The strings become part of the environment; they have to be
        // static.
        static char lines[] = "LINES=225";
        static char columns[] = "COLUMNS=300";
        putenv(lines);
        putenv(columns);
    }
#endif

    // Fire-up curses.
    initscr();

    // Make characters typed by the user immediately available to
    // the program.
    cbreak();

    // Tell courses not to echo user-input (TADS does the echoing).
    noecho();

    // Hide the cursor.  This avoids the "crazy cursor jumping"
    // problem on *really* slow terminals, as TADS constantly moves
    // the cursor all over the place.
    curs_set(0);

    // Tell courses not to try to translate the RETURN/ENTER key on
    // input (or else getch() and friends would never report that
    // key), and the '\n' character on output (since the osgen layer
    // handles newlines).
    nonl();

    // Initialize colors if we want color support and the terminal supports it.
    if ((opts.useColors and has_colors()) or opts.forceColors) {
        this->fColorsEnabled = true;
        start_color();
        // Assign terminal default foreground/background colors
        // to color number -1 / color pair 0.
#if HAVE_USE_DEFAULT_COLORS
        if (opts.defColors) {
            use_default_colors();
        }
#endif
        // Initialize the curses color-pairs we use.
        //
        // This is paranoia, but better to make sure that curses
        // will use the right colors.  The paranoid part of this
        // is that we assume that there might be some curses
        // version out there that does not use monotonically
        // increasing values for the COLOR_* symbols.
        init_pair(makeColorPair(FROB_BLACK,   FROB_BLACK), COLOR_BLACK,   COLOR_BLACK);
        init_pair(makeColorPair(FROB_RED,     FROB_BLACK), COLOR_RED,     COLOR_BLACK);
        init_pair(makeColorPair(FROB_GREEN,   FROB_BLACK), COLOR_GREEN,   COLOR_BLACK);
        init_pair(makeColorPair(FROB_YELLOW,  FROB_BLACK), COLOR_YELLOW,  COLOR_BLACK);
        init_pair(makeColorPair(FROB_BLUE,    FROB_BLACK), COLOR_BLUE,    COLOR_BLACK);
        init_pair(makeColorPair(FROB_MAGENTA, FROB_BLACK), COLOR_MAGENTA, COLOR_BLACK);
        init_pair(makeColorPair(FROB_CYAN,    FROB_BLACK), COLOR_CYAN,    COLOR_BLACK);
        // White on black is wired to color pair 0 by
        // definition; we can't and don't need to initialize it.
        //init_pair(makeColorPair(FROB_WHITE,   FROB_BLACK), COLOR_WHITE,   COLOR_BLACK);

        init_pair(makeColorPair(FROB_BLACK,   FROB_RED), COLOR_BLACK,   COLOR_RED);
        init_pair(makeColorPair(FROB_RED,     FROB_RED), COLOR_RED,     COLOR_RED);
        init_pair(makeColorPair(FROB_GREEN,   FROB_RED), COLOR_GREEN,   COLOR_RED);
        init_pair(makeColorPair(FROB_YELLOW,  FROB_RED), COLOR_YELLOW,  COLOR_RED);
        init_pair(makeColorPair(FROB_BLUE,    FROB_RED), COLOR_BLUE,    COLOR_RED);
        init_pair(makeColorPair(FROB_MAGENTA, FROB_RED), COLOR_MAGENTA, COLOR_RED);
        init_pair(makeColorPair(FROB_CYAN,    FROB_RED), COLOR_CYAN,    COLOR_RED);
        init_pair(makeColorPair(FROB_WHITE,   FROB_RED), COLOR_WHITE,   COLOR_RED);

        init_pair(makeColorPair(FROB_BLACK,   FROB_GREEN), COLOR_BLACK,   COLOR_GREEN);
        init_pair(makeColorPair(FROB_RED,     FROB_GREEN), COLOR_RED,     COLOR_GREEN);
        init_pair(makeColorPair(FROB_GREEN,   FROB_GREEN), COLOR_GREEN,   COLOR_GREEN);
        init_pair(makeColorPair(FROB_YELLOW,  FROB_GREEN), COLOR_YELLOW,  COLOR_GREEN);
        init_pair(makeColorPair(FROB_BLUE,    FROB_GREEN), COLOR_BLUE,    COLOR_GREEN);
        init_pair(makeColorPair(FROB_MAGENTA, FROB_GREEN), COLOR_MAGENTA, COLOR_GREEN);
        init_pair(makeColorPair(FROB_CYAN,    FROB_GREEN), COLOR_CYAN,    COLOR_GREEN);
        init_pair(makeColorPair(FROB_WHITE,   FROB_GREEN), COLOR_WHITE,   COLOR_GREEN);

        init_pair(makeColorPair(FROB_BLACK,   FROB_YELLOW), COLOR_BLACK,   COLOR_YELLOW);
        init_pair(makeColorPair(FROB_RED,     FROB_YELLOW), COLOR_RED,     COLOR_YELLOW);
        init_pair(makeColorPair(FROB_GREEN,   FROB_YELLOW), COLOR_GREEN,   COLOR_YELLOW);
        init_pair(makeColorPair(FROB_YELLOW,  FROB_YELLOW), COLOR_YELLOW,  COLOR_YELLOW);
        init_pair(makeColorPair(FROB_BLUE,    FROB_YELLOW), COLOR_BLUE,    COLOR_YELLOW);
        init_pair(makeColorPair(FROB_MAGENTA, FROB_YELLOW), COLOR_MAGENTA, COLOR_YELLOW);
        init_pair(makeColorPair(FROB_CYAN,    FROB_YELLOW), COLOR_CYAN,    COLOR_YELLOW);
        init_pair(makeColorPair(FROB_WHITE,   FROB_YELLOW), COLOR_WHITE,   COLOR_YELLOW);

        init_pair(makeColorPair(FROB_BLACK,   FROB_BLUE), COLOR_BLACK,   COLOR_BLUE);
        init_pair(makeColorPair(FROB_RED,     FROB_BLUE), COLOR_RED,     COLOR_BLUE);
        init_pair(makeColorPair(FROB_GREEN,   FROB_BLUE), COLOR_GREEN,   COLOR_BLUE);
        init_pair(makeColorPair(FROB_YELLOW,  FROB_BLUE), COLOR_YELLOW,  COLOR_BLUE);
        init_pair(makeColorPair(FROB_BLUE,    FROB_BLUE), COLOR_BLUE,    COLOR_BLUE);
        init_pair(makeColorPair(FROB_MAGENTA, FROB_BLUE), COLOR_MAGENTA, COLOR_BLUE);
        init_pair(makeColorPair(FROB_CYAN,    FROB_BLUE), COLOR_CYAN,    COLOR_BLUE);
        init_pair(makeColorPair(FROB_WHITE,   FROB_BLUE), COLOR_WHITE,   COLOR_BLUE);

        init_pair(makeColorPair(FROB_BLACK,   FROB_MAGENTA), COLOR_BLACK,   COLOR_MAGENTA);
        init_pair(makeColorPair(FROB_RED,     FROB_MAGENTA), COLOR_RED,     COLOR_MAGENTA);
        init_pair(makeColorPair(FROB_GREEN,   FROB_MAGENTA), COLOR_GREEN,   COLOR_MAGENTA);
        init_pair(makeColorPair(FROB_YELLOW,  FROB_MAGENTA), COLOR_YELLOW,  COLOR_MAGENTA);
        init_pair(makeColorPair(FROB_BLUE,    FROB_MAGENTA), COLOR_BLUE,    COLOR_MAGENTA);
        init_pair(makeColorPair(FROB_MAGENTA, FROB_MAGENTA), COLOR_MAGENTA, COLOR_MAGENTA);
        init_pair(makeColorPair(FROB_CYAN,    FROB_MAGENTA), COLOR_CYAN,    COLOR_MAGENTA);
        init_pair(makeColorPair(FROB_WHITE,   FROB_MAGENTA), COLOR_WHITE,   COLOR_MAGENTA);

        init_pair(makeColorPair(FROB_BLACK,   FROB_CYAN), COLOR_BLACK,   COLOR_CYAN);
        init_pair(makeColorPair(FROB_RED,     FROB_CYAN), COLOR_RED,     COLOR_CYAN);
        init_pair(makeColorPair(FROB_GREEN,   FROB_CYAN), COLOR_GREEN,   COLOR_CYAN);
        init_pair(makeColorPair(FROB_YELLOW,  FROB_CYAN), COLOR_YELLOW,  COLOR_CYAN);
        init_pair(makeColorPair(FROB_BLUE,    FROB_CYAN), COLOR_BLUE,    COLOR_CYAN);
        init_pair(makeColorPair(FROB_MAGENTA, FROB_CYAN), COLOR_MAGENTA, COLOR_CYAN);
        init_pair(makeColorPair(FROB_CYAN,    FROB_CYAN), COLOR_CYAN,    COLOR_CYAN);
        init_pair(makeColorPair(FROB_WHITE,   FROB_CYAN), COLOR_WHITE,   COLOR_CYAN);

        init_pair(makeColorPair(FROB_BLACK,   FROB_WHITE), COLOR_BLACK,   COLOR_WHITE);
        init_pair(makeColorPair(FROB_RED,     FROB_WHITE), COLOR_RED,     COLOR_WHITE);
        init_pair(makeColorPair(FROB_GREEN,   FROB_WHITE), COLOR_GREEN,   COLOR_WHITE);
        init_pair(makeColorPair(FROB_YELLOW,  FROB_WHITE), COLOR_YELLOW,  COLOR_WHITE);
        init_pair(makeColorPair(FROB_BLUE,    FROB_WHITE), COLOR_BLUE,    COLOR_WHITE);
        init_pair(makeColorPair(FROB_MAGENTA, FROB_WHITE), COLOR_MAGENTA, COLOR_WHITE);
        init_pair(makeColorPair(FROB_CYAN,    FROB_WHITE), COLOR_CYAN,    COLOR_WHITE);
        init_pair(makeColorPair(FROB_WHITE,   FROB_WHITE), COLOR_WHITE,   COLOR_WHITE);
    }
}